

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdfjob-c.cc
# Opt level: O0

int qpdfjob_run(qpdfjob_handle j)

{
  qpdfjob_handle j_00;
  int iVar1;
  anon_class_1_0_00000001 local_31;
  function<int_(_qpdfjob_handle_*)> local_30;
  qpdfjob_handle local_10;
  qpdfjob_handle j_local;
  
  local_10 = j;
  QUtil::setLineBuf(_stdout);
  j_00 = local_10;
  std::function<int(_qpdfjob_handle*)>::function<qpdfjob_run::__0,void>
            ((function<int(_qpdfjob_handle*)> *)&local_30,&local_31);
  iVar1 = wrap_qpdfjob(j_00,&local_30);
  std::function<int_(_qpdfjob_handle_*)>::~function(&local_30);
  return iVar1;
}

Assistant:

int
qpdfjob_run(qpdfjob_handle j)
{
    QUtil::setLineBuf(stdout);
    return wrap_qpdfjob(j, [](qpdfjob_handle jh) {
        jh->j.run();
        return jh->j.getExitCode();
    });
}